

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.c
# Opt level: O1

void err_msg(err_lvl_t lvl,char *path,long ln,char *fmt,...)

{
  char in_AL;
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  char msg [1024];
  undefined8 local_4f8;
  undefined1 *local_4f0;
  undefined1 *local_4e8;
  undefined1 local_4d8 [32];
  undefined8 local_4b8;
  undefined8 local_4b0;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  undefined8 local_438;
  char local_428 [1032];
  
  if (in_AL != '\0') {
    local_4a8 = in_XMM0_Qa;
    local_498 = in_XMM1_Qa;
    local_488 = in_XMM2_Qa;
    local_478 = in_XMM3_Qa;
    local_468 = in_XMM4_Qa;
    local_458 = in_XMM5_Qa;
    local_448 = in_XMM6_Qa;
    local_438 = in_XMM7_Qa;
  }
  if (err_cb != (err_cb_f)0x0) {
    local_4e8 = local_4d8;
    local_4f0 = &stack0x00000008;
    local_4f8 = 0x3000000020;
    local_4b8 = in_R8;
    local_4b0 = in_R9;
    vsnprintf(local_428,0x400,fmt,&local_4f8);
    if (path == (char *)0x0) {
      (*err_cb)(err_user_data,lvl,"%s",local_428);
    }
    else {
      pcVar1 = path2basename(path);
      if (lvl == ERR_INFO) {
        pcVar3 = "%s: %s(%ld): %s";
        pcVar2 = "INFO";
        lvl = ERR_INFO;
      }
      else if (lvl == ERR_INFOCONT) {
        pcVar3 = "%s(%ld): %s";
        lvl = ERR_INFOCONT;
        pcVar2 = pcVar1;
        pcVar1 = (char *)ln;
        ln = (long)local_428;
      }
      else {
        pcVar2 = err_msg::err_prefix[lvl];
        pcVar3 = "%s: \"%s\", line %ld: %s";
      }
      (*err_cb)(err_user_data,lvl,pcVar3,pcVar2,pcVar1,ln);
    }
  }
  return;
}

Assistant:

void
err_msg(err_lvl_t lvl, const char *path, long ln, const char *fmt, ...)
{
    static const char *err_prefix[ERR_MAX] = {
        "DEBUG", "INFO", "INFOCONT", "WARN", "ERROR", "FATAL"
    };

    char msg[1024];
    va_list ap;

    if (!err_cb)
        return;

    va_start(ap, fmt);
    vsnprintf(msg, sizeof(msg), fmt, ap);
    va_end(ap);

    if (path) {
        const char *fname = path2basename(path);
        if (lvl == ERR_INFOCONT)
    	    err_cb(err_user_data, lvl, "%s(%ld): %s", fname, ln, msg);
        else if (lvl == ERR_INFO)
            err_cb(err_user_data, lvl, "%s: %s(%ld): %s", err_prefix[lvl], fname, ln, msg);
        else
    	    err_cb(err_user_data, lvl, "%s: \"%s\", line %ld: %s", err_prefix[lvl], fname, ln, msg);
    } else {
        err_cb(err_user_data, lvl, "%s", msg);
    }
}